

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O3

int kputuw(uint c,kstring_t *s)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  char buf [16];
  undefined8 uStack_30;
  byte local_28 [24];
  
  if (c == 0) {
    sVar5 = s->l;
    uVar3 = sVar5 + 1;
    if (uVar3 < s->m) {
      pcVar4 = s->s;
    }
    else {
      uVar3 = uVar3 >> 1 | uVar3;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      sVar6 = (uVar3 >> 0x10 | uVar3) + 1;
      s->m = sVar6;
      uStack_30 = 0x1167d4;
      pcVar4 = (char *)realloc(s->s,sVar6);
      if (pcVar4 == (char *)0x0) goto LAB_001167f6;
      s->s = pcVar4;
      sVar5 = s->l;
      uVar3 = sVar5 + 1;
    }
    s->l = uVar3;
    pcVar4[sVar5] = '0';
  }
  else {
    uVar3 = 1;
    do {
      uVar7 = uVar3;
      local_28[uVar7 - 1] = (char)c + (char)(c / 10) * -10 | 0x30;
      bVar2 = 9 < c;
      uVar3 = uVar7 + 1;
      c = c / 10;
    } while (bVar2);
    uVar3 = (uVar7 + 1 & 0xffffffff) + s->l;
    if (s->m <= uVar3) {
      uVar3 = uVar3 >> 1 | uVar3;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      sVar6 = (uVar3 >> 0x10 | uVar3) + 1;
      s->m = sVar6;
      uStack_30 = 0x11674a;
      pcVar4 = (char *)realloc(s->s,sVar6);
      if (pcVar4 == (char *)0x0) goto LAB_001167f6;
      s->s = pcVar4;
    }
    uVar7 = uVar7 - 1;
    do {
      bVar1 = local_28[uVar7 & 0xffffffff];
      sVar5 = s->l;
      s->l = sVar5 + 1;
      s->s[sVar5] = bVar1;
      uVar7 = uVar7 - 1;
    } while (1 < (int)uVar7 + 2);
  }
  pcVar4 = (char *)s->l;
  s->s[(long)pcVar4] = '\0';
LAB_001167f6:
  return (int)pcVar4;
}

Assistant:

static inline int kputuw(unsigned c, kstring_t *s)
{
	char buf[16];
	int l, i;
	unsigned x;
	if (c == 0) return kputc('0', s);
	for (l = 0, x = c; x > 0; x /= 10) buf[l++] = x%10 + '0';
	if (s->l + l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	for (i = l - 1; i >= 0; --i) s->s[s->l++] = buf[i];
	s->s[s->l] = 0;
	return 0;
}